

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PrimitiveTypeHelper<5>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  CodedOutputStream *in_RSI;
  void *in_RDI;
  int32 in_stack_ffffffffffffffdc;
  
  Get<int>(in_RDI);
  io::CodedOutputStream::WriteVarint32SignExtended(in_RSI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteInt32NoTag(Get<int32>(ptr), output);
  }